

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O1

void __thiscall
Secp256k1_CombinePubkeySecp256k1EcTest_Test::TestBody
          (Secp256k1_CombinePubkeySecp256k1EcTest_Test *this)

{
  pointer pcVar1;
  pointer paVar2;
  pointer puVar3;
  bool bVar4;
  secp256k1_context_struct *context;
  pointer __x;
  char *message;
  AssertionResult gtest_ar;
  ByteData actual;
  Secp256k1 secp;
  CombinePubkeyTestVector test_vector;
  string local_c8;
  internal local_a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  ByteData local_90;
  AssertHelper local_78;
  Secp256k1 local_70;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  context = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&local_70,context);
  paVar2 = combine_test_vectors.
           super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (combine_test_vectors.
      super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      combine_test_vectors.
      super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __x = combine_test_vectors.
          super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>.
          _M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                (&local_68,&__x->pubkeys);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = (__x->expect)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + (__x->expect)._M_string_length);
      cfd::core::ByteData::ByteData(&local_90);
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          cfd::core::Secp256k1::CombinePubkeySecp256k1Ec((ByteData *)&local_c8,&local_70,&local_68);
          puVar3 = local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_c8._M_dataplus._M_p;
          local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_c8._M_string_length;
          local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_c8.field_2._M_allocated_capacity;
          local_c8._M_dataplus._M_p = (pointer)0x0;
          local_c8._M_string_length = 0;
          local_c8.field_2._M_allocated_capacity = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar3 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(puVar3);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
                   ,99,
                   "Expected: actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))();
          }
          local_c8._M_dataplus._M_p = (pointer)0x0;
        }
      }
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_c8,&local_90);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                (local_a0,"test_vector.expect","actual.GetHex()",&local_50,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c8);
        message = "";
        if (local_98.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_98.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
                   ,100,message);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 8))();
          }
          local_c8._M_dataplus._M_p = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_90.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_68);
      __x = __x + 1;
    } while (__x != paVar2);
  }
  return;
}

Assistant:

TEST(Secp256k1, CombinePubkeySecp256k1EcTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (CombinePubkeyTestVector test_vector : combine_test_vectors) {
    ByteData actual;
    EXPECT_NO_THROW(
        actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys));
    EXPECT_EQ(test_vector.expect, actual.GetHex());
  }
}